

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[9],timeval,char>(JObject *this,char (*k) [9],timeval *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[9],_timeval>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[9],_timeval> field;
  char *c_local;
  timeval *v_local;
  char (*k_local) [9];
  JObject *this_local;
  
  field.v = (timeval *)c;
  Field<char[9],_timeval>::Field((Field<char[9],_timeval> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[9],timeval>,char>
                       ((Field<char[9],_timeval> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }